

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O3

void __thiscall flow::IRHandler::dump(IRHandler *this)

{
  _List_node_base *p_Var1;
  iterator __end1;
  
  printf(".handler %s %*c; entryPoint = %%%s\n",
         (this->super_Constant).super_Value.name_._M_dataplus._M_p,
         (ulong)(10 - (int)(this->super_Constant).super_Value.name_._M_string_length),0x20,
         (this->blocks_).
         super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_next);
  for (p_Var1 = (this->blocks_).
                super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->blocks_; p_Var1 = p_Var1->_M_next) {
    BasicBlock::dump((BasicBlock *)p_Var1[1]._M_next);
  }
  putchar(10);
  return;
}

Assistant:

void IRHandler::dump() {
  printf(".handler %s %*c; entryPoint = %%%s\n", name().c_str(),
         10 - (int)name().size(), ' ', getEntryBlock()->name().c_str());

  for (auto& bb : blocks_)
    bb->dump();

  printf("\n");
}